

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdquery.cc
# Opt level: O0

bool __thiscall bdQuery::proxies(bdQuery *this,list<bdId,_std::allocator<bdId>_> *answer)

{
  iterator this_00;
  bool bVar1;
  pointer __x;
  _Self local_38;
  _List_node_base *local_30;
  int local_24;
  iterator iStack_20;
  int i;
  iterator it;
  list<bdId,_std::allocator<bdId>_> *answer_local;
  bdQuery *this_local;
  
  it._M_node = (_List_node_base *)answer;
  std::_List_iterator<bdPeer>::_List_iterator(&stack0xffffffffffffffe0);
  local_24 = 0;
  local_30 = (_List_node_base *)
             std::__cxx11::list<bdPeer,_std::allocator<bdPeer>_>::begin(&this->mProxiesFlagged);
  iStack_20 = (iterator)local_30;
  while( true ) {
    local_38._M_node =
         (_List_node_base *)
         std::__cxx11::list<bdPeer,_std::allocator<bdPeer>_>::end(&this->mProxiesFlagged);
    bVar1 = std::operator!=(&stack0xffffffffffffffe0,&local_38);
    this_00 = it;
    if (!bVar1) break;
    __x = std::_List_iterator<bdPeer>::operator->(&stack0xffffffffffffffe0);
    std::__cxx11::list<bdId,_std::allocator<bdId>_>::push_back
              ((list<bdId,_std::allocator<bdId>_> *)this_00._M_node,&__x->mPeerId);
    std::_List_iterator<bdPeer>::operator++(&stack0xffffffffffffffe0,0);
    local_24 = local_24 + 1;
  }
  return 0 < local_24;
}

Assistant:

bool bdQuery::proxies(std::list<bdId> &answer) {
	/* get all the matches to our query */
    std::list<bdPeer>::iterator it;
	int i = 0;
	for (it = mProxiesFlagged.begin(); it != mProxiesFlagged.end(); it++, i++)
		answer.push_back(it->mPeerId);
	return (i > 0);
}